

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void in_memory_snapshot_compaction_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc_00;
  fdb_status fVar4;
  fdb_kvs_handle *pfVar6;
  size_t sVar7;
  int iVar5;
  size_t sVar8;
  size_t sVar9;
  fdb_iterator *doc_01;
  fdb_config *fconfig;
  fdb_config *pfVar10;
  fdb_kvs_handle *in_RCX;
  fdb_config *extraout_RDX;
  fdb_kvs_handle *handle;
  fdb_config *pfVar11;
  fdb_config *doc_02;
  uint uVar12;
  ulong unaff_RBP;
  __atomic_base<unsigned_long> _Var13;
  char *pcVar14;
  fdb_iterator *pfVar15;
  fdb_config *unaff_R12;
  fdb_config *__s;
  fdb_kvs_handle *unaff_R13;
  long lVar16;
  fdb_kvs_handle *pfVar17;
  __atomic_base<unsigned_long> handle_00;
  ulong uVar18;
  fdb_config *unaff_R15;
  fdb_doc **doc_03;
  fdb_iterator *config;
  char keystr [6];
  fdb_file_handle *db_file;
  fdb_kvs_handle *snap;
  fdb_doc *doc;
  fdb_iterator *fit;
  char valuestr [10];
  fdb_kvs_handle *db;
  fdb_kvs_handle *db2;
  size_t valuelen;
  void *value_out;
  cb_inmem_snap_args cargs;
  fdb_kvs_info info;
  timeval __test_begin;
  char key [256];
  char cmd [256];
  fdb_doc *pfStack_ca8;
  fdb_iterator *pfStack_ca0;
  int iStack_c94;
  fdb_kvs_handle *pfStack_c90;
  timeval tStack_c88;
  fdb_config *pfStack_c78;
  fdb_config *pfStack_c70;
  fdb_kvs_handle *pfStack_c68;
  fdb_config *pfStack_c60;
  fdb_iterator *pfStack_c58;
  fdb_iterator *pfStack_c50;
  fdb_kvs_handle *pfStack_c40;
  fdb_config *pfStack_c38;
  undefined1 auStack_c30 [24];
  fdb_kvs_handle *pfStack_c18;
  fdb_config *pfStack_c10;
  fdb_kvs_handle *pfStack_c08;
  fdb_kvs_handle *pfStack_c00;
  undefined1 auStack_bf8 [80];
  undefined8 auStack_ba8 [5];
  fdb_doc *apfStack_b80 [6];
  fdb_kvs_info fStack_b50;
  timeval tStack_b20;
  undefined1 auStack_b10 [280];
  fdb_iterator fStack_9f8;
  fdb_config fStack_8f8;
  fdb_config fStack_7f8;
  fdb_kvs_handle *pfStack_700;
  fdb_config *pfStack_6f8;
  fdb_kvs_handle *pfStack_6f0;
  fdb_config *pfStack_6e8;
  fdb_kvs_handle *pfStack_6e0;
  code *pcStack_6d8;
  fdb_iterator *pfStack_6c8;
  fdb_kvs_handle *pfStack_6c0;
  fdb_kvs_handle *pfStack_6b8;
  fdb_kvs_handle *pfStack_6b0;
  fdb_custom_cmp_variable *pp_Stack_6a8;
  size_t sStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_kvs_info fStack_690;
  undefined1 auStack_660 [14];
  undefined2 uStack_652;
  fdb_config fStack_650;
  fdb_config fStack_550;
  fdb_kvs_handle *pfStack_448;
  fdb_config *pfStack_440;
  fdb_kvs_handle *pfStack_438;
  fdb_kvs_handle *pfStack_430;
  fdb_config *pfStack_428;
  code *pcStack_420;
  undefined1 local_410 [48];
  undefined2 local_3e0;
  fdb_kvs_handle *local_3d8;
  __atomic_base<unsigned_long> local_3d0;
  void *local_3c8;
  atomic<unsigned_long> local_3c0;
  undefined1 local_3b8 [64];
  fdb_kvs_info local_378;
  timeval local_348;
  fdb_config local_338;
  fdb_custom_cmp_variable local_228;
  void *local_220;
  undefined1 local_218;
  undefined2 local_210;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_1f0 [3];
  code *local_1d8;
  undefined4 local_1d0;
  filemgr_ops *local_1c8;
  char local_138 [8];
  fdb_encryption_key afStack_130 [7];
  
  pcStack_420 = (code *)0x113179;
  gettimeofday(&local_348,(__timezone_ptr_t)0x0);
  local_410._4_2_ = 100;
  local_410._0_4_ = 0x3530256b;
  local_3e0 = 100;
  local_410._40_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_memcpy(&afStack_130[0].algorithm,"t* > errorlog.txt",0x12);
  builtin_strncpy(local_138,"rm -rf  ",8);
  afStack_130[0]._0_8_ = 0x7365745f6363766d;
  pcStack_420 = (code *)0x1131c6;
  system(local_138);
  pcStack_420 = (code *)0x1131cb;
  memleak_start();
  pcStack_420 = (code *)0x1131d5;
  pfVar6 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)&stack0xfffffffffffffdd0;
  pcStack_420 = (code *)0x1131e8;
  fdb_get_default_config();
  local_210 = 0x201;
  local_218 = 1;
  local_220 = (void *)0x2;
  local_1f0[0]._0_1_ = 1;
  local_228 = (fdb_custom_cmp_variable)0x0;
  local_1d8 = cb_inmem_snap;
  local_1d0 = 2;
  local_1c8 = (filemgr_ops *)local_3b8;
  pcStack_420 = (code *)0x113232;
  fdb_get_default_kvs_config();
  pcStack_420 = (code *)0x113246;
  fVar4 = fdb_open((fdb_file_handle **)(local_410 + 8),"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011364a;
  in_RCX = (fdb_kvs_handle *)(local_3b8 + 0x28);
  pcStack_420 = (code *)0x11326c;
  fVar4 = fdb_kvs_open((fdb_file_handle *)local_410._8_8_,&local_3d8,"db",(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
  in_RCX = (fdb_kvs_handle *)(local_3b8 + 0x28);
  pcStack_420 = (code *)0x113292;
  fVar4 = fdb_kvs_open((fdb_file_handle *)local_410._8_8_,(fdb_kvs_handle **)&local_3d0,"db",
                       (fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113654;
  local_3b8._0_8_ = local_3d0._M_i;
  local_3b8._8_8_ = (_func_ssize_t_int_void_ptr_size_t_cs_off_t *)0xa;
  local_3b8._24_8_ = local_410;
  unaff_R15 = (fdb_config *)(local_410 + 0x28);
  local_3b8._16_4_ = 0x20;
  pfVar17 = (fdb_kvs_handle *)((long)&pfVar6->kvs + 2);
  unaff_R12 = &local_338;
  unaff_RBP = 0;
  local_3b8._32_8_ = unaff_R15;
  do {
    pcStack_420 = (code *)0x1132ee;
    sprintf((char *)unaff_R12,local_410,unaff_RBP);
    *(undefined4 *)&pfVar6->kvs_config = 0x78787878;
    *(uint32_t *)&(pfVar6->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar6->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)((long)&pfVar6->kvs + 6) = 0x3e;
    *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
    pcStack_420 = (code *)0x113319;
    sprintf((char *)pfVar6,(char *)unaff_R15,unaff_RBP);
    unaff_R13 = local_3d8;
    pcStack_420 = (code *)0x113326;
    sVar7 = strlen((char *)unaff_R12);
    pcStack_420 = (code *)0x11333e;
    in_RCX = pfVar6;
    fVar4 = fdb_set_kv(unaff_R13,unaff_R12,sVar7 + 1,pfVar6,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_420 = (code *)0x113614;
      in_memory_snapshot_compaction_test();
      goto LAB_00113614;
    }
    uVar12 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar12;
  } while (uVar12 != 10);
  pcStack_420 = (code *)0x11335c;
  fVar4 = fdb_commit((fdb_file_handle *)local_410._8_8_,'\x01');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113659;
  pcStack_420 = (code *)0x113375;
  fVar4 = fdb_compact((fdb_file_handle *)local_410._8_8_,"./mvcc_test2");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
  pcStack_420 = (code *)0x113393;
  fVar4 = fdb_snapshot_open(local_3d8,(fdb_kvs_handle **)(local_410 + 0x10),0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113663;
  pcStack_420 = (code *)0x1133ad;
  fVar4 = fdb_get_kvs_info((fdb_kvs_handle *)local_410._16_8_,&local_378);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113668;
  if ((docio_handle *)local_378.last_seqnum != (docio_handle *)0xb) {
    pcStack_420 = (code *)0x1133cd;
    in_memory_snapshot_compaction_test();
  }
  in_RCX = (fdb_kvs_handle *)0x0;
  pcStack_420 = (code *)0x1133ed;
  fVar4 = fdb_iterator_init((fdb_kvs_handle *)local_410._16_8_,(fdb_iterator **)(local_410 + 0x20),
                            (void *)0x0,0,(void *)0x0,0,0);
  __s = unaff_R12;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
  unaff_R15 = &local_338;
  unaff_RBP = 0;
  do {
    local_410._24_8_ = (fdb_config *)0x0;
    pcStack_420 = (code *)0x113417;
    fVar4 = fdb_iterator_get((fdb_iterator *)local_410._32_8_,(fdb_doc **)(local_410 + 0x18));
    unaff_R12 = (fdb_config *)local_410._24_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    if ((uint)unaff_RBP < 10) {
      pcStack_420 = (code *)0x113435;
      sprintf((char *)unaff_R15,local_410,unaff_RBP);
      *(undefined4 *)&pfVar6->kvs_config = 0x78787878;
      *(uint32_t *)&(pfVar6->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar6->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)((long)&pfVar6->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
      pcStack_420 = (code *)0x113462;
      sprintf((char *)pfVar6,local_410 + 0x28,unaff_RBP);
      unaff_R12 = (fdb_config *)local_410._24_8_;
      unaff_R13 = *(fdb_kvs_handle **)(local_410._24_8_ + 0x20);
      pcStack_420 = (code *)0x11347b;
      iVar5 = bcmp(unaff_R13,unaff_R15,*(size_t *)(uint16_t *)local_410._24_8_);
      if (iVar5 != 0) goto LAB_0011362f;
      unaff_R13 = *(fdb_kvs_handle **)((long)unaff_R12 + 0x40);
      pcStack_420 = (code *)0x113498;
      iVar5 = bcmp(unaff_R13,pfVar6,*(uint64_t *)((long)unaff_R12 + 0x10));
      if (iVar5 != 0) goto LAB_0011363f;
    }
    else {
      local_338.chunksize = 0x656e;
      local_338._2_2_ = 0x5f77;
      local_338.blocksize = 0x79656b;
      *(void **)&pfVar6->kvs_config = (void *)0x756c61765f77656e;
      *(undefined2 *)&(pfVar6->kvs_config).custom_cmp = 0x65;
      unaff_R13 = *(fdb_kvs_handle **)(local_410._24_8_ + 0x20);
      pcStack_420 = (code *)0x1134df;
      iVar5 = bcmp(unaff_R13,unaff_R15,*(size_t *)(uint16_t *)local_410._24_8_);
      if (iVar5 != 0) goto LAB_00113614;
      unaff_R13 = *(fdb_kvs_handle **)((long)unaff_R12 + 0x40);
      pcStack_420 = (code *)0x1134fc;
      iVar5 = bcmp(unaff_R13,pfVar6,*(uint64_t *)((long)unaff_R12 + 0x10));
      if (iVar5 != 0) goto LAB_00113624;
    }
    unaff_RBP = (ulong)((uint)unaff_RBP + 1);
    pcStack_420 = (code *)0x11350e;
    fdb_doc_free((fdb_doc *)unaff_R12);
    pcStack_420 = (code *)0x113518;
    fVar4 = fdb_iterator_next((fdb_iterator *)local_410._32_8_);
    __s = unaff_R12;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP != 0xb) goto LAB_00113672;
  pcStack_420 = (code *)0x113533;
  fVar4 = fdb_iterator_close((fdb_iterator *)local_410._32_8_);
  handle_00._M_i = local_410._16_8_;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113677;
  unaff_R15 = &local_338;
  pcStack_420 = (code *)0x113550;
  sVar7 = strlen((char *)unaff_R15);
  in_RCX = (fdb_kvs_handle *)&local_3c0;
  pcStack_420 = (code *)0x113569;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)handle_00._M_i,unaff_R15,sVar7 + 1,(void **)in_RCX,
                     (size_t *)&local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
  pcStack_420 = (code *)0x113586;
  _Var13._M_i = (__int_type)pfVar6;
  iVar5 = bcmp((void *)local_3c0.super___atomic_base<unsigned_long>._M_i,pfVar6,(size_t)local_3c8);
  handle_00 = local_3c0.super___atomic_base<unsigned_long>._M_i;
  if (iVar5 != 0) goto LAB_00113681;
  pcStack_420 = (code *)0x113596;
  fdb_free_block((void *)local_3c0.super___atomic_base<unsigned_long>._M_i);
  pcStack_420 = (code *)0x1135a0;
  fdb_kvs_close((fdb_kvs_handle *)local_410._16_8_);
  pcStack_420 = (code *)0x1135aa;
  fVar4 = fdb_close((fdb_file_handle *)local_410._8_8_);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
  pcStack_420 = (code *)0x1135b7;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pcStack_420 = (code *)0x1135c7;
    free(pfVar6);
    pcStack_420 = (code *)0x1135cc;
    memleak_end();
    pcVar14 = "%s PASSED\n";
    if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
      pcVar14 = "%s FAILED\n";
    }
    pcStack_420 = (code *)0x1135fd;
    fprintf(_stderr,pcVar14,"in-memory snapshot with concurrent compaction test");
    return;
  }
  goto LAB_00113691;
LAB_00113ba0:
  pcStack_6d8 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_6d8 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_6d8 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  pfVar17 = (fdb_kvs_handle *)&fStack_550;
  __s = &fStack_650;
  pcStack_6d8 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_c50 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar10 = fconfig;
LAB_0011467d:
  fconfig = pfVar10;
  pfStack_c50 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_c50 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar11 = (fdb_config *)&pfStack_c38;
  pfStack_c50 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00113614:
  pcStack_420 = (code *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pcStack_420 = (code *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pcStack_420 = (code *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pcStack_420 = (code *)0x11364a;
  in_memory_snapshot_compaction_test();
LAB_0011364a:
  pcStack_420 = (code *)0x11364f;
  in_memory_snapshot_compaction_test();
LAB_0011364f:
  pcStack_420 = (code *)0x113654;
  in_memory_snapshot_compaction_test();
LAB_00113654:
  pcStack_420 = (code *)0x113659;
  in_memory_snapshot_compaction_test();
LAB_00113659:
  pcStack_420 = (code *)0x11365e;
  in_memory_snapshot_compaction_test();
LAB_0011365e:
  pcStack_420 = (code *)0x113663;
  in_memory_snapshot_compaction_test();
LAB_00113663:
  pcStack_420 = (code *)0x113668;
  in_memory_snapshot_compaction_test();
LAB_00113668:
  pcStack_420 = (code *)0x11366d;
  in_memory_snapshot_compaction_test();
  __s = unaff_R12;
LAB_0011366d:
  pcStack_420 = (code *)0x113672;
  in_memory_snapshot_compaction_test();
LAB_00113672:
  pcStack_420 = (code *)0x113677;
  in_memory_snapshot_compaction_test();
LAB_00113677:
  handle_00._M_i = (__int_type)pfVar17;
  pcStack_420 = (code *)0x11367c;
  in_memory_snapshot_compaction_test();
LAB_0011367c:
  pcStack_420 = (code *)0x113681;
  in_memory_snapshot_compaction_test();
LAB_00113681:
  pcStack_420 = (code *)0x11368c;
  _Var13._M_i = handle_00._M_i;
  in_memory_snapshot_compaction_test();
LAB_0011368c:
  pcStack_420 = (code *)0x113691;
  in_memory_snapshot_compaction_test();
LAB_00113691:
  pcStack_420 = cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar18 = _Var13._M_i & 0xffffffff;
  pfVar17 = (fdb_kvs_handle *)0x0;
  pcStack_6d8 = (code *)0x1136be;
  pfStack_448 = pfVar6;
  pfStack_440 = __s;
  pfStack_438 = unaff_R13;
  pfStack_430 = (fdb_kvs_handle *)handle_00._M_i;
  pfStack_428 = unaff_R15;
  pcStack_420 = (code *)unaff_RBP;
  gettimeofday((timeval *)auStack_660,(__timezone_ptr_t)0x0);
  if ((int)_Var13._M_i != 2) {
    return;
  }
  pfVar11 = extraout_RDX;
  if (extraout_RDX == (fdb_config *)0x0) {
LAB_00113be0:
    pcStack_6d8 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_6d8 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_6d8 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_6d8 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_6d8 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_6d8 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_6d8 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar6 = unaff_R13;
LAB_00113c03:
    pcStack_6d8 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    handle = in_RCX;
    pcStack_6d8 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_6d8 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (fdb_kvs_handle *)
                CONCAT26(local_410._6_2_,CONCAT24(local_410._4_2_,local_410._0_4_));
    pfVar6 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(unaff_R13->kvs_config).custom_cmp + 4);
    *(int *)((long)&(unaff_R13->kvs_config).custom_cmp + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_6d8 = (code *)0x11370e;
      fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&unaff_R13->kvs_config,&pfStack_6c0,
                                0xffffffffffffffff);
      pfVar17 = pfVar6;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_6d8 = (code *)0x113725;
      fVar4 = fdb_get_kvs_info(pfStack_6c0,&fStack_690);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      in_RCX = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
      if (fStack_690.last_seqnum != (long)*(int *)&(unaff_R13->kvs_config).custom_cmp) {
        pcStack_6d8 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_6d8 = (code *)0x11376a;
      pfStack_6b0 = pfVar6;
      pp_Stack_6a8 = (fdb_custom_cmp_variable *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_6c0,&pfStack_6c8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfVar11 = (fdb_config *)(auStack_660 + 10);
        uVar18 = 0;
        do {
          pfStack_6b8 = (fdb_kvs_handle *)0x0;
          pcStack_6d8 = (code *)0x1137a1;
          fVar4 = fdb_iterator_get(pfStack_6c8,(fdb_doc **)&pfStack_6b8);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar16 = CONCAT26(local_410._6_2_,CONCAT24(local_410._4_2_,local_410._0_4_));
          pcStack_6d8 = (code *)0x1137c1;
          sprintf((char *)&fStack_550,*(char **)(lVar16 + 0x18),uVar18);
          sVar7 = (size_t)*(int *)(lVar16 + 0x10);
          pcStack_6d8 = (code *)0x1137d5;
          memset(&fStack_650,0x78,sVar7);
          builtin_strncpy((char *)((long)&pfVar11->chunksize + sVar7),"<end",4);
          *(undefined2 *)((long)&uStack_652 + sVar7) = 0x3e;
          pcStack_6d8 = (code *)0x1137f5;
          sprintf((char *)&fStack_650,*(char **)(lVar16 + 0x20),uVar18);
          unaff_R13 = pfStack_6b8;
          in_RCX = (fdb_kvs_handle *)pfStack_6b8->op_stats;
          pcStack_6d8 = (code *)0x11380d;
          iVar5 = bcmp(in_RCX,&fStack_550,*(size_t *)&pfStack_6b8->kvs_config);
          if (iVar5 != 0) {
            pcStack_6d8 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_6d8 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          in_RCX = (fdb_kvs_handle *)(unaff_R13->field_6).seqtree;
          pcStack_6d8 = (code *)0x113828;
          iVar5 = bcmp(in_RCX,&fStack_650,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113b90;
          uVar18 = (ulong)((int)uVar18 + 1);
          pcStack_6d8 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_6d8 = (code *)0x113844;
          fVar4 = fdb_iterator_next(pfStack_6c8);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar18 != *(int *)pp_Stack_6a8) {
          pcStack_6d8 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_6d8 = (code *)0x113863;
        fVar4 = fdb_iterator_close(pfStack_6c8);
        pfVar6 = pfStack_6b0;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_6d8 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    in_RCX = (fdb_kvs_handle *)&fStack_550;
    fStack_550.chunksize = 0x656e;
    fStack_550._2_2_ = 0x5f77;
    fStack_550.blocksize = 0x79656b;
    pfVar11 = &fStack_650;
    fStack_650.chunksize = 0x656e;
    fStack_650._2_2_ = 0x5f77;
    fStack_650.blocksize = 0x756c6176;
    fStack_650.buffercache_size._0_2_ = 0x65;
    pfVar17 = *(fdb_kvs_handle **)&unaff_R13->kvs_config;
    pcStack_6d8 = (code *)0x1138b7;
    pfStack_6b0 = pfVar6;
    sVar7 = strlen((char *)in_RCX);
    __s = (fdb_config *)(sVar7 + 1);
    pcStack_6d8 = (code *)0x1138c3;
    sVar7 = strlen((char *)pfVar11);
    pcStack_6d8 = (code *)0x1138d8;
    fVar4 = fdb_set_kv(pfVar17,in_RCX,(size_t)__s,pfVar11,sVar7 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_6d8 = (code *)0x1138f5;
    fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&unaff_R13->kvs_config,&pfStack_6c0,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_6d8 = (code *)0x11390c;
    fVar4 = fdb_get_kvs_info(pfStack_6c0,&fStack_690);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    in_RCX = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
    if (fStack_690.last_seqnum != (long)*(int *)&(unaff_R13->kvs_config).custom_cmp + 1U) {
      pcStack_6d8 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_6d8 = (code *)0x11394a;
    fVar4 = fdb_iterator_init(pfStack_6c0,&pfStack_6c8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar6 = unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    __s = &fStack_650;
    uVar18 = 0;
    do {
      pfStack_6b8 = (fdb_kvs_handle *)0x0;
      pcStack_6d8 = (code *)0x11397c;
      fVar4 = fdb_iterator_get(pfStack_6c8,(fdb_doc **)&pfStack_6b8);
      unaff_R13 = pfStack_6b8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar18 < *(int *)in_RCX) {
        lVar16 = CONCAT26(local_410._6_2_,CONCAT24(local_410._4_2_,local_410._0_4_));
        pcStack_6d8 = (code *)0x1139a4;
        sprintf((char *)&fStack_550,*(char **)(lVar16 + 0x18),uVar18);
        sVar7 = (size_t)*(int *)(lVar16 + 0x10);
        pcStack_6d8 = (code *)0x1139b8;
        memset(__s,0x78,sVar7);
        *(undefined4 *)(auStack_660 + sVar7 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_652 + sVar7) = 0x3e;
        pcStack_6d8 = (code *)0x1139dd;
        sprintf((char *)__s,*(char **)(lVar16 + 0x20),uVar18);
        unaff_R13 = pfStack_6b8;
        pfVar11 = (fdb_config *)pfStack_6b8->op_stats;
        pcStack_6d8 = (code *)0x1139f5;
        iVar5 = bcmp(pfVar11,&fStack_550,*(size_t *)&pfStack_6b8->kvs_config);
        if (iVar5 != 0) goto LAB_00113bb0;
        pfVar11 = (fdb_config *)(unaff_R13->field_6).seqtree;
        pcStack_6d8 = (code *)0x113a10;
        iVar5 = bcmp(pfVar11,__s,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113bc0;
      }
      else {
        fStack_550.chunksize = 0x656e;
        fStack_550._2_2_ = 0x5f77;
        fStack_550.blocksize = 0x79656b;
        fStack_650.chunksize = 0x656e;
        fStack_650._2_2_ = 0x5f77;
        fStack_650.blocksize = 0x756c6176;
        fStack_650.buffercache_size._0_2_ = 0x65;
        pfVar11 = (fdb_config *)pfStack_6b8->op_stats;
        pcStack_6d8 = (code *)0x113a5f;
        iVar5 = bcmp(pfVar11,&fStack_550,*(size_t *)&pfStack_6b8->kvs_config);
        if (iVar5 != 0) goto LAB_00113bd0;
        pfVar11 = (fdb_config *)(unaff_R13->field_6).seqtree;
        pcStack_6d8 = (code *)0x113a7a;
        iVar5 = bcmp(pfVar11,__s,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113ba0;
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pcStack_6d8 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_6d8 = (code *)0x113a96;
      fVar4 = fdb_iterator_next(pfStack_6c8);
      pfVar6 = unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar18 != *(int *)in_RCX + 1) {
      pcStack_6d8 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_6d8 = (code *)0x113ab4;
    fVar4 = fdb_iterator_close(pfStack_6c8);
    pfVar17 = pfStack_6b0;
    handle = pfStack_6c0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    pfVar11 = &fStack_550;
    pcStack_6d8 = (code *)0x113ad6;
    sVar7 = strlen((char *)pfVar11);
    pcStack_6d8 = (code *)0x113aef;
    fVar4 = fdb_get_kv(handle,pfVar11,sVar7 + 1,&pfStack_698,&sStack_6a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_6d8 = (code *)0x113b11;
    iVar5 = bcmp(pfStack_698,&fStack_650,sStack_6a0);
    handle = pfStack_698;
    if (iVar5 == 0) {
      pcStack_6d8 = (code *)0x113b21;
      fdb_free_block(pfStack_698);
LAB_00113b21:
      pcStack_6d8 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_6c0);
      return;
    }
  }
  pcStack_6d8 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_c50 = (fdb_iterator *)0x113c42;
  pfStack_700 = handle;
  pfStack_6f8 = __s;
  pfStack_6f0 = pfVar6;
  pfStack_6e8 = pfVar11;
  pfStack_6e0 = pfVar17;
  pcStack_6d8 = (code *)uVar18;
  gettimeofday(&tStack_b20,(__timezone_ptr_t)0x0);
  pfStack_c50 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_c50 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_7f8;
  pfStack_c50 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_b10;
  pfStack_c50 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_7f8.buffercache_size = 0;
  fStack_7f8.wal_threshold = 0x400;
  fStack_7f8.seqtree_opt = '\x01';
  fStack_7f8.flags = 1;
  fStack_7f8.compaction_threshold = '\0';
  pfStack_c50 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_config *)(auStack_c30 + 0x10);
  pfStack_c50 = (fdb_iterator *)0x113cb7;
  fVar4 = fdb_open((fdb_file_handle **)pfVar11,"./mvcc_test1",fconfig);
  doc_01 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_c50 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default((fdb_file_handle *)auStack_c30._16_8_,&pfStack_c40,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_c50 = (fdb_iterator *)0x113ce2;
    fVar4 = fdb_snapshot_open(pfStack_c40,(fdb_kvs_handle **)(auStack_c30 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_c50 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_c30._8_8_,&fStack_b50);
    if ((fdb_config *)fStack_b50.last_seqnum != (fdb_config *)0x0) {
      pfStack_c50 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar11 = (fdb_config *)auStack_c30;
    pfStack_c50 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_c30._8_8_,(fdb_iterator **)pfVar11,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_c50 = (fdb_iterator *)0x113d3a;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_c30._0_8_);
    pfVar10 = __s;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_c50 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_c30._0_8_);
    pfStack_c50 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_c30._8_8_);
    lVar16 = 0;
    uVar18 = 0;
    do {
      pfStack_c50 = (fdb_iterator *)0x113d79;
      sprintf(auStack_b10 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_9f8,"meta%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_8f8,"body%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113dc1;
      sVar7 = strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x113dcc;
      sVar8 = strlen((char *)&fStack_9f8);
      pfStack_c50 = (fdb_iterator *)0x113dd7;
      sVar9 = strlen((char *)&fStack_8f8);
      pfStack_c50 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_bf8 + lVar16),auStack_b10 + 0x18,sVar7,&fStack_9f8,sVar8,
                     &fStack_8f8,sVar9);
      pfStack_c50 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_c40,*(fdb_doc **)(auStack_bf8 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar18 != 5);
    pfStack_c50 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\x01');
    uVar18 = 5;
    doc_03 = (fdb_doc **)(auStack_bf8 + 0x28);
    do {
      pfStack_c50 = (fdb_iterator *)0x113e52;
      sprintf(auStack_b10 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_9f8,"meta%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_8f8,"body%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113e92;
      sVar7 = strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x113e9d;
      sVar8 = strlen((char *)&fStack_9f8);
      pfStack_c50 = (fdb_iterator *)0x113ea8;
      sVar9 = strlen((char *)&fStack_8f8);
      pfStack_c50 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(doc_03,auStack_b10 + 0x18,sVar7,&fStack_9f8,sVar8,&fStack_8f8,sVar9);
      pfStack_c50 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_c40,*doc_03);
      uVar18 = uVar18 + 1;
      doc_03 = doc_03 + 1;
    } while (uVar18 != 9);
    fconfig = (fdb_config *)(auStack_b10 + 0x18);
    pfStack_c50 = (fdb_iterator *)0x113f04;
    sprintf((char *)fconfig,"key%d",9);
    config = &fStack_9f8;
    pfStack_c50 = (fdb_iterator *)0x113f22;
    sprintf((char *)config,"meta%d",9);
    pfVar10 = &fStack_8f8;
    pfStack_c50 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar10,"Body%d",9);
    pfVar11 = (fdb_config *)(auStack_bf8 + 0x48);
    pfStack_c50 = (fdb_iterator *)0x113f50;
    pfVar6 = (fdb_kvs_handle *)strlen((char *)fconfig);
    pfStack_c50 = (fdb_iterator *)0x113f5b;
    doc_01 = (fdb_iterator *)strlen((char *)config);
    pfStack_c50 = (fdb_iterator *)0x113f66;
    sVar7 = strlen((char *)pfVar10);
    pfStack_c50 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar11,fconfig,(size_t)pfVar6,config,(size_t)doc_01,pfVar10,sVar7);
    pfStack_c50 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_c40,(fdb_doc *)auStack_bf8._72_8_);
    pfStack_c50 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    **(undefined1 **)(auStack_bf8._72_8_ + 0x40) = 0x62;
    pfStack_c50 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_c40,(fdb_doc *)auStack_bf8._72_8_);
    pfStack_c50 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    pfStack_c10 = *(fdb_config **)(auStack_bf8._72_8_ + 0x28);
    pfStack_c50 = (fdb_iterator *)0x113fdf;
    fVar4 = fdb_snapshot_open(pfStack_c40,&pfStack_c00,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_c50 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_c40,(fdb_doc *)auStack_bf8._72_8_);
    pfStack_c50 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    uVar18 = 10;
    pfVar11 = (fdb_config *)0x50;
    do {
      pfStack_c50 = (fdb_iterator *)0x11402c;
      sprintf(auStack_b10 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_9f8,"meta%d",uVar18 & 0xffffffff);
      pfVar10 = &fStack_8f8;
      pfStack_c50 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar10,"body%d",uVar18 & 0xffffffff);
      doc_01 = (fdb_iterator *)(auStack_bf8 + (long)pfVar11);
      pfStack_c50 = (fdb_iterator *)0x114074;
      fconfig = (fdb_config *)strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x11407f;
      pfVar6 = (fdb_kvs_handle *)strlen((char *)&fStack_9f8);
      pfStack_c50 = (fdb_iterator *)0x11408a;
      sVar7 = strlen((char *)pfVar10);
      pfStack_c50 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_01,auStack_b10 + 0x18,(size_t)fconfig,&fStack_9f8,
                     (size_t)pfVar6,pfVar10,sVar7);
      pfStack_c50 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_c40,*(fdb_doc **)(auStack_bf8 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      pfVar11 = (fdb_config *)((long)pfVar11 + 8);
    } while (uVar18 != 0xf);
    pfStack_c50 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\x01');
    pfStack_c50 = (fdb_iterator *)0x1140f6;
    fVar4 = fdb_set_log_callback(pfStack_c40,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_c50 = (fdb_iterator *)0x114112;
    fVar4 = fdb_snapshot_open(pfStack_c40,(fdb_kvs_handle **)(auStack_c30 + 8),999999);
    fconfig = pfStack_c10;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_c50 = (fdb_iterator *)0x114132;
    fVar4 = fdb_snapshot_open(pfStack_c40,(fdb_kvs_handle **)(auStack_c30 + 8),
                              (fdb_seqnum_t)pfStack_c10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_c50 = (fdb_iterator *)0x11414c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_c30._8_8_,&pfStack_c18,(fdb_seqnum_t)fconfig
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_c50 = (fdb_iterator *)0x11415e;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_c30._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_c50 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_c18,&fStack_b50);
    if ((fdb_config *)fStack_b50.last_seqnum != fconfig) {
      pfStack_c50 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar18 = 0xf;
    config = (fdb_iterator *)apfStack_b80;
    do {
      pfStack_c50 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_b10 + 0x18,"key%d",uVar18 & 0xffffffff);
      doc_01 = &fStack_9f8;
      pfStack_c50 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_01,"meta%d",uVar18 & 0xffffffff);
      fconfig = &fStack_8f8;
      pfStack_c50 = (fdb_iterator *)0x1141ef;
      sprintf((char *)fconfig,"body%d",uVar18 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x1141f7;
      pfVar10 = (fdb_config *)strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x114202;
      pfVar6 = (fdb_kvs_handle *)strlen((char *)doc_01);
      pfStack_c50 = (fdb_iterator *)0x11420d;
      sVar7 = strlen((char *)fconfig);
      pfStack_c50 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config,auStack_b10 + 0x18,(size_t)pfVar10,doc_01,(size_t)pfVar6,
                     fconfig,sVar7);
      pfStack_c50 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_c40,*(fdb_doc **)config);
      uVar18 = uVar18 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar18 != 0x14);
    pfStack_c50 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    pfStack_c50 = (fdb_iterator *)0x11426d;
    fVar4 = fdb_snapshot_open(pfStack_c00,&pfStack_c08,0xffffffffffffffff);
    pfVar11 = (fdb_config *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar11 = (fdb_config *)&pfStack_c38;
    pfStack_c50 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar11,
                   (void *)(*(size_t **)
                             (auStack_bf8 + (((long)pfStack_c10 << 0x20) + 0x100000000 >> 0x1d)))[4]
                   ,**(size_t **)(auStack_bf8 + (((long)pfStack_c10 << 0x20) + 0x100000000 >> 0x1d))
                   ,(void *)0x0,0,(void *)0x0,0);
    pfStack_c50 = (fdb_iterator *)0x1142c5;
    fVar4 = fdb_get_metaonly(pfStack_c18,(fdb_doc *)pfStack_c38);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_c50 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_c38);
    pfStack_c50 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_c38,*(void **)(auStack_bf8._40_8_ + 0x20),
                   *(size_t *)(uint16_t *)auStack_bf8._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_c50 = (fdb_iterator *)0x11430c;
    fVar4 = fdb_get_metaonly(pfStack_c18,(fdb_doc *)pfStack_c38);
    __s = (fdb_config *)auStack_bf8._40_8_;
    doc_02 = pfStack_c38;
    pfVar11 = (fdb_config *)&pfStack_c38;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    fconfig = *(fdb_config **)&pfStack_c38->seqtree_opt;
    config = *(fdb_iterator **)(auStack_bf8._40_8_ + 0x20);
    pfStack_c50 = (fdb_iterator *)0x114336;
    iVar5 = bcmp(fconfig,config,*(size_t *)(uint16_t *)auStack_bf8._40_8_);
    if (iVar5 != 0) goto LAB_001146d4;
    fconfig = (fdb_config *)doc_02->compactor_sleep_duration;
    config = *(fdb_iterator **)((long)__s + 0x38);
    pfStack_c50 = (fdb_iterator *)0x114357;
    iVar5 = bcmp(fconfig,config,*(uint64_t *)((long)__s + 8));
    if (iVar5 != 0) goto LAB_001146df;
    pfStack_c50 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_02);
    pfStack_c50 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_c38,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_c38->compaction_buf_maxsize = 6;
    pfStack_c38->cleanup_cache_onclose = false;
    pfStack_c38->compress_document_body = false;
    pfStack_c38->compaction_mode = '\0';
    pfStack_c38->compaction_threshold = '\0';
    pfStack_c50 = (fdb_iterator *)0x11439d;
    fVar4 = fdb_get_byseq(pfStack_c18,(fdb_doc *)pfStack_c38);
    pfVar11 = pfStack_c38;
    doc_02 = (fdb_config *)&pfStack_c38;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    sVar7._0_2_ = pfStack_c38->chunksize;
    sVar7._2_2_ = *(undefined2 *)&pfStack_c38->field_0x2;
    sVar7._4_4_ = pfStack_c38->blocksize;
    fconfig = *(fdb_config **)&pfStack_c38->seqtree_opt;
    config = *(fdb_iterator **)(auStack_bf8._40_8_ + 0x20);
    pfStack_c50 = (fdb_iterator *)0x1143c6;
    iVar5 = bcmp(fconfig,config,sVar7);
    __s = (fdb_config *)auStack_bf8._40_8_;
    if (iVar5 != 0) goto LAB_001146ef;
    fconfig = *(fdb_config **)&pfVar11->multi_kv_instances;
    config = *(fdb_iterator **)(auStack_bf8._40_8_ + 0x40);
    pfStack_c50 = (fdb_iterator *)0x1143e6;
    iVar5 = bcmp(fconfig,config,pfVar11->wal_threshold);
    if (iVar5 != 0) goto LAB_001146fa;
    pfStack_c50 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar11 = (fdb_config *)&pfStack_c38;
    pfStack_c38 = (fdb_config *)0x0;
    pfVar6 = (fdb_kvs_handle *)0x0;
    pfStack_c50 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_c18,(fdb_iterator **)auStack_c30,(void *)0x0,0,(void *)0x0,0,0);
    pfVar10 = fconfig;
    do {
      pfStack_c50 = (fdb_iterator *)0x114432;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_c30._0_8_,(fdb_doc **)pfVar11);
      fconfig = pfStack_c38;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_c50 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        fconfig = pfVar10;
LAB_0011465c:
        pfStack_c50 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_c50 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      sVar8._0_2_ = pfStack_c38->chunksize;
      sVar8._2_2_ = *(undefined2 *)&pfStack_c38->field_0x2;
      sVar8._4_4_ = pfStack_c38->blocksize;
      config = *(fdb_iterator **)&pfStack_c38->seqtree_opt;
      doc_01 = *(fdb_iterator **)(auStack_bf8 + (long)pfVar6 * 8);
      __s = (fdb_config *)doc_01->_seqnum;
      pfStack_c50 = (fdb_iterator *)0x11445a;
      iVar5 = bcmp(config,__s,sVar8);
      pfVar10 = fconfig;
      if (iVar5 != 0) {
        pfStack_c50 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config = (fdb_iterator *)fconfig->compactor_sleep_duration;
      __s = (fdb_config *)doc_01->tree_cursor_start;
      pfStack_c50 = (fdb_iterator *)0x114479;
      iVar5 = bcmp(config,__s,fconfig->buffercache_size);
      if (iVar5 != 0) goto LAB_00114667;
      config = *(fdb_iterator **)&fconfig->multi_kv_instances;
      __s = (fdb_config *)doc_01->tree_cursor_prev;
      pfStack_c50 = (fdb_iterator *)0x114498;
      iVar5 = bcmp(config,__s,fconfig->wal_threshold);
      if (iVar5 != 0) goto LAB_0011465c;
      pfStack_c50 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)fconfig);
      pfStack_c38 = (fdb_config *)0x0;
      pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
      pfStack_c50 = (fdb_iterator *)0x1144be;
      pfVar15 = (fdb_iterator *)auStack_c30._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_c30._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)pfVar6 == 10) {
      pfStack_c50 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_c30._0_8_);
      pfVar6 = (fdb_kvs_handle *)0x0;
      pfStack_c50 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_c08,(fdb_iterator **)auStack_c30,(void *)0x0,0,(void *)0x0,0,0);
      pfVar11 = (fdb_config *)&pfStack_c38;
      do {
        pfStack_c50 = (fdb_iterator *)0x114510;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_c30._0_8_,(fdb_doc **)pfVar11);
        fconfig = pfStack_c38;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        sVar9._0_2_ = pfStack_c38->chunksize;
        sVar9._2_2_ = *(undefined2 *)&pfStack_c38->field_0x2;
        sVar9._4_4_ = pfStack_c38->blocksize;
        config = *(fdb_iterator **)&pfStack_c38->seqtree_opt;
        doc_01 = *(fdb_iterator **)(auStack_bf8 + (long)pfVar6 * 8);
        __s = (fdb_config *)doc_01->_seqnum;
        pfStack_c50 = (fdb_iterator *)0x114538;
        iVar5 = bcmp(config,__s,sVar9);
        if (iVar5 != 0) goto LAB_00114672;
        config = (fdb_iterator *)fconfig->compactor_sleep_duration;
        __s = (fdb_config *)doc_01->tree_cursor_start;
        pfStack_c50 = (fdb_iterator *)0x114557;
        iVar5 = bcmp(config,__s,fconfig->buffercache_size);
        if (iVar5 != 0) goto LAB_0011468d;
        config = *(fdb_iterator **)&fconfig->multi_kv_instances;
        __s = (fdb_config *)doc_01->tree_cursor_prev;
        pfStack_c50 = (fdb_iterator *)0x114576;
        iVar5 = bcmp(config,__s,fconfig->wal_threshold);
        if (iVar5 != 0) goto LAB_00114682;
        pfStack_c50 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)fconfig);
        pfStack_c38 = (fdb_config *)0x0;
        pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
        pfStack_c50 = (fdb_iterator *)0x11459c;
        pfVar15 = (fdb_iterator *)auStack_c30._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_c30._0_8_);
        pfVar10 = fconfig;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)pfVar6 == 10) {
        pfStack_c50 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_c30._0_8_);
        pfStack_c50 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_c40);
        pfStack_c50 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_c00);
        pfStack_c50 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_c08);
        pfStack_c50 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_c18);
        pfStack_c50 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_c30._16_8_);
        lVar16 = 0;
        do {
          pfStack_c50 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_bf8 + lVar16 * 8));
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x14);
        pfStack_c50 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_c50 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pfStack_c50 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar14,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_c50 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_c50 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar10 = __s;
LAB_001146a2:
    pfStack_c50 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_c50 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_c50 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_c50 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_c50 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_c50 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_c50 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_c50 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_c50 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    __s = pfVar10;
    doc_02 = pfVar11;
    pfStack_c50 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_c50 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_c50 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar11 = doc_02;
    pfStack_c50 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_c50 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_c50 = (fdb_iterator *)0x114705;
    pfVar15 = config;
    snapshot_clone_test();
  }
  pfStack_c50 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_c50 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_ca8 = (fdb_doc *)0x0;
  pfVar17 = pfVar15->handle;
  iVar5 = *(int *)&pfVar15->seqtree_iterator;
  pfStack_c78 = pfVar11;
  pfStack_c70 = __s;
  pfStack_c68 = pfVar6;
  pfStack_c60 = fconfig;
  pfStack_c58 = config;
  pfStack_c50 = doc_01;
  gettimeofday(&tStack_c88,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar15->hbtrie_iterator,&pfStack_c90,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar16 = 0;
  iStack_c94 = iVar5;
  fdb_iterator_init(pfStack_c90,&pfStack_ca0,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_ca0,&pfStack_ca8);
    doc_00 = pfStack_ca8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_ca8->key;
    lVar2 = *(long *)(&(pfVar17->kvs_config).create_if_missing + lVar16 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_ca8->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc_00->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc_00->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc_00);
    pfStack_ca8 = (fdb_doc *)0x0;
    lVar16 = lVar16 + 1;
    fVar4 = fdb_iterator_next(pfStack_ca0);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_c94 / 2 == (int)lVar16) {
    fdb_iterator_close(pfStack_ca0);
    fdb_kvs_close(pfStack_c90);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void in_memory_snapshot_compaction_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, c, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "k%05d";
    char valuestr[] = "value%08d";
    void *value_out;
    size_t valuelen;
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    struct cb_inmem_snap_args cargs;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.wal_threshold = n/5;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.compaction_cb = cb_inmem_snap;
    config.compaction_cb_mask = FDB_CS_MOVE_DOC;
    config.compaction_cb_ctx = &cargs;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(db_file, &db2, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    cargs.handle = db2;
    cargs.move_count = 0;
    cargs.n = n;
    cargs.keystr = keystr;
    cargs.valuestr = valuestr;
    cargs.value_len = value_len;

    // write
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(db_file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_compact(db_file, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open in-memory snapshot
    s = fdb_snapshot_open(db, &snap, FDB_SNAPSHOT_INMEM);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(snap, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(info.last_seqnum == (fdb_seqnum_t)n+1);

    s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        if (c < n) {
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            sprintf(value, valuestr, idx);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        } else {
            // new document
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        }

        c++;
        fdb_doc_free(doc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    TEST_CHK(c == n + 1);

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CMP(value_out, value, valuelen);
    fdb_free_block(value_out);

    fdb_kvs_close(snap);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);

    memleak_end();

    TEST_RESULT("in-memory snapshot with concurrent compaction test");
}